

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O0

void __thiscall
brynet::net::TcpService::startWorkerThread
          (TcpService *this,size_t threadNum,FRAME_CALLBACK *callback)

{
  bool bVar1;
  reference this_00;
  function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)> local_108;
  shared_ptr<bool> local_e8;
  shared_ptr<brynet::net::EventLoop> local_d8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [24];
  shared_ptr<bool> runIoLoop;
  shared_ptr<brynet::net::EventLoop> eventLoop;
  shared_ptr<brynet::net::IOLoopData> *v;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
  *__range1;
  undefined4 local_40;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> lck;
  FRAME_CALLBACK *callback_local;
  size_t threadNum_local;
  TcpService *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&lock,&this->mServiceGuard);
  std::lock_guard<std::mutex>::lock_guard(&local_30,&this->mIOLoopGuard);
  bVar1 = std::
          vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
          ::empty(&this->mIOLoopDatas);
  if (bVar1) {
    std::make_shared<bool,bool>((bool *)&stack0xffffffffffffffb0);
    std::shared_ptr<bool>::operator=(&this->mRunIOLoop,(shared_ptr<bool> *)&stack0xffffffffffffffb0)
    ;
    std::shared_ptr<bool>::~shared_ptr((shared_ptr<bool> *)&stack0xffffffffffffffb0);
    std::
    vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
    ::resize(&this->mIOLoopDatas,threadNum);
    __end1 = std::
             vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
             ::begin(&this->mIOLoopDatas);
    v = (shared_ptr<brynet::net::IOLoopData> *)
        std::
        vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>
        ::end(&this->mIOLoopDatas);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::shared_ptr<brynet::net::IOLoopData>_*,_std::vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>_>
                                  *)&v);
      if (!bVar1) break;
      this_00 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<brynet::net::IOLoopData>_*,_std::vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>_>
                ::operator*(&__end1);
      std::make_shared<brynet::net::EventLoop>();
      std::shared_ptr<bool>::shared_ptr((shared_ptr<bool> *)(local_a8 + 0x10),&this->mRunIOLoop);
      std::shared_ptr<brynet::net::EventLoop>::shared_ptr
                ((shared_ptr<brynet::net::EventLoop> *)(local_c8 + 0x10),
                 (shared_ptr<brynet::net::EventLoop> *)
                 &runIoLoop.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::function<void_(const_std::shared_ptr<brynet::net::EventLoop>_&)>::function
                (&local_108,callback);
      std::shared_ptr<bool>::shared_ptr(&local_e8,(shared_ptr<bool> *)(local_a8 + 0x10));
      std::shared_ptr<brynet::net::EventLoop>::shared_ptr
                (&local_d8,
                 (shared_ptr<brynet::net::EventLoop> *)
                 &runIoLoop.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      make_shared<std::thread,brynet::net::TcpService::startWorkerThread(unsigned_long,std::function<void(std::shared_ptr<brynet::net::EventLoop>const&)>)::__0>
                ((type *)local_c8);
      IOLoopData::Create((IOLoopData *)local_a8,(PTR *)(local_c8 + 0x10),
                         (shared_ptr<std::thread> *)local_c8);
      std::shared_ptr<brynet::net::IOLoopData>::operator=
                (this_00,(shared_ptr<brynet::net::IOLoopData> *)local_a8);
      std::shared_ptr<brynet::net::IOLoopData>::~shared_ptr
                ((shared_ptr<brynet::net::IOLoopData> *)local_a8);
      std::shared_ptr<std::thread>::~shared_ptr((shared_ptr<std::thread> *)local_c8);
      startWorkerThread(unsigned_long,std::function<void(std::shared_ptr<brynet::net::EventLoop>const&)>)
      ::$_0::~__0((__0 *)&local_108);
      std::shared_ptr<brynet::net::EventLoop>::~shared_ptr
                ((shared_ptr<brynet::net::EventLoop> *)(local_c8 + 0x10));
      std::shared_ptr<bool>::~shared_ptr((shared_ptr<bool> *)(local_a8 + 0x10));
      std::shared_ptr<brynet::net::EventLoop>::~shared_ptr
                ((shared_ptr<brynet::net::EventLoop> *)
                 &runIoLoop.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<brynet::net::IOLoopData>_*,_std::vector<std::shared_ptr<brynet::net::IOLoopData>,_std::allocator<std::shared_ptr<brynet::net::IOLoopData>_>_>_>
      ::operator++(&__end1);
    }
    local_40 = 0;
  }
  else {
    local_40 = 1;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  std::lock_guard<std::mutex>::~lock_guard(&lock);
  return;
}

Assistant:

void TcpService::startWorkerThread(size_t threadNum, FRAME_CALLBACK callback)
{
    std::lock_guard<std::mutex> lck(mServiceGuard);
    std::lock_guard<std::mutex> lock(mIOLoopGuard);

    if (!mIOLoopDatas.empty())
    {
        return;
    }

    mRunIOLoop = std::make_shared<bool>(true);

    mIOLoopDatas.resize(threadNum);
    for (auto& v : mIOLoopDatas)
    {
        auto eventLoop = std::make_shared<EventLoop>();
        auto runIoLoop = mRunIOLoop;
        v = IOLoopData::Create(eventLoop, std::make_shared<std::thread>([callback,
            runIoLoop,
            eventLoop]() {
            while (*runIoLoop)
            {
                auto timeout = std::chrono::milliseconds(sDefaultLoopTimeOutMS);
                if (!eventLoop->getTimerMgr()->isEmpty())
                {
                    timeout = duration_cast<milliseconds>(eventLoop->getTimerMgr()->nearLeftTime());
                }
                eventLoop->loop(timeout.count());
                if (callback != nullptr)
                {
                    callback(eventLoop);
                }
            }
        }));
    }
}